

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O0

void __thiscall icu_63::double_conversion::Bignum::SubtractBignum(Bignum *this,Bignum *other)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  Chunk difference_1;
  Chunk difference;
  int i;
  Chunk borrow;
  int offset;
  Bignum *other_local;
  Bignum *this_local;
  
  Align(this,other);
  iVar1 = other->exponent_ - this->exponent_;
  difference = 0;
  for (difference_1 = 0; (int)difference_1 < other->used_digits_; difference_1 = difference_1 + 1) {
    puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,difference_1 + iVar1);
    uVar2 = *puVar3;
    puVar3 = Vector<unsigned_int>::operator[](&other->bigits_,difference_1);
    uVar2 = (uVar2 - *puVar3) - difference;
    puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,difference_1 + iVar1);
    *puVar3 = uVar2 & 0xfffffff;
    difference = uVar2 >> 0x1f;
  }
  for (; difference != 0; difference = uVar2 - difference >> 0x1f) {
    puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,difference_1 + iVar1);
    uVar2 = *puVar3;
    puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,difference_1 + iVar1);
    *puVar3 = uVar2 - difference & 0xfffffff;
    difference_1 = difference_1 + 1;
  }
  Clamp(this);
  return;
}

Assistant:

void Bignum::SubtractBignum(const Bignum& other) {
  ASSERT(IsClamped());
  ASSERT(other.IsClamped());
  // We require this to be bigger than other.
  ASSERT(LessEqual(other, *this));

  Align(other);

  int offset = other.exponent_ - exponent_;
  Chunk borrow = 0;
  int i;
  for (i = 0; i < other.used_digits_; ++i) {
    ASSERT((borrow == 0) || (borrow == 1));
    Chunk difference = bigits_[i + offset] - other.bigits_[i] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  while (borrow != 0) {
    Chunk difference = bigits_[i + offset] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
    ++i;
  }
  Clamp();
}